

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_rdsregion_create_postpaid_db_instance.cc
# Opt level: O2

int __thiscall
aliyun::RdsRegion::CreatePostpaidDBInstance
          (RdsRegion *this,RdsRegionCreatePostpaidDBInstanceRequestType *req,
          RdsRegionCreatePostpaidDBInstanceResponseType *response,RdsRegionErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  AliRpcRequest *this_00;
  Value *pVVar3;
  char *pcVar4;
  allocator<char> local_5e1;
  string local_5e0;
  allocator<char> local_5bb;
  allocator<char> local_5ba;
  allocator<char> local_5b9;
  Value val;
  string str_response;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string secheme;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar4 = "http";
  if (this->use_tls_ != false) {
    pcVar4 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar4,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->version_,(allocator<char> *)&local_5e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->appid_,(allocator<char> *)&val);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,this->secret_,&local_5e1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_180,&local_1a0,&local_1c0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  if (((this->use_tls_ == false) && (pcVar4 = this->proxy_host_, pcVar4 != (char *)0x0)) &&
     (*pcVar4 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,pcVar4,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"Action",(allocator<char> *)&local_5e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"CreatePostpaidDBInstance",&local_5e1);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_220,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  if ((req->owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"OwnerId",(allocator<char> *)&local_5e0);
    std::__cxx11::string::string((string *)&local_280,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_260,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
  }
  if ((req->resource_owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"ResourceOwnerAccount",(allocator<char> *)&local_5e0);
    std::__cxx11::string::string((string *)&local_2c0,(string *)&req->resource_owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2a0,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2a0);
  }
  if ((req->resource_owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"ResourceOwnerId",(allocator<char> *)&local_5e0);
    std::__cxx11::string::string((string *)&local_300,(string *)&req->resource_owner_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2e0,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2e0);
  }
  if ((req->client_token)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"ClientToken",(allocator<char> *)&local_5e0);
    std::__cxx11::string::string((string *)&local_340,(string *)&req->client_token);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_320,&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_320);
  }
  if ((req->engine)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,"Engine",(allocator<char> *)&local_5e0);
    std::__cxx11::string::string((string *)&local_380,(string *)&req->engine);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_360,&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_360);
  }
  if ((req->engine_version)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a0,"EngineVersion",(allocator<char> *)&local_5e0);
    std::__cxx11::string::string((string *)&local_3c0,(string *)&req->engine_version);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3a0,&local_3c0);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_3a0);
  }
  if ((req->db_instance_class)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e0,"DBInstanceClass",(allocator<char> *)&local_5e0);
    std::__cxx11::string::string((string *)&local_400,(string *)&req->db_instance_class);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3e0,&local_400);
    std::__cxx11::string::~string((string *)&local_400);
    std::__cxx11::string::~string((string *)&local_3e0);
  }
  if ((req->db_instance_storage)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_420,"DBInstanceStorage",(allocator<char> *)&local_5e0);
    std::__cxx11::string::string((string *)&local_440,(string *)&req->db_instance_storage);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_420,&local_440);
    std::__cxx11::string::~string((string *)&local_440);
    std::__cxx11::string::~string((string *)&local_420);
  }
  if ((req->db_instance_net_type)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_460,"DBInstanceNetType",(allocator<char> *)&local_5e0);
    std::__cxx11::string::string((string *)&local_480,(string *)&req->db_instance_net_type);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_460,&local_480);
    std::__cxx11::string::~string((string *)&local_480);
    std::__cxx11::string::~string((string *)&local_460);
  }
  if ((req->db_instance_description)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4a0,"DBInstanceDescription",(allocator<char> *)&local_5e0);
    std::__cxx11::string::string((string *)&local_4c0,(string *)&req->db_instance_description);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_4a0,&local_4c0);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::__cxx11::string::~string((string *)&local_4a0);
  }
  if ((req->security_ip_list)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4e0,"SecurityIPList",(allocator<char> *)&local_5e0);
    std::__cxx11::string::string((string *)&local_500,(string *)&req->security_ip_list);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_4e0,&local_500);
    std::__cxx11::string::~string((string *)&local_500);
    std::__cxx11::string::~string((string *)&local_4e0);
  }
  if ((req->owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_520,"OwnerAccount",(allocator<char> *)&local_5e0);
    std::__cxx11::string::string((string *)&local_540,(string *)&req->owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_520,&local_540);
    std::__cxx11::string::~string((string *)&local_540);
    std::__cxx11::string::~string((string *)&local_520);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_560,"RegionId",(allocator<char> *)&local_5e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_580,this->region_id_,&local_5e1);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_560,&local_580);
    std::__cxx11::string::~string((string *)&local_580);
    std::__cxx11::string::~string((string *)&local_560);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (RdsRegionErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_(&local_5e0,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5e0,anon_var_dwarf_2dde16 + 9,&local_5e1);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)&local_5e0);
        std::__cxx11::string::~string((string *)&local_5e0);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_(&local_5e0,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5e0,anon_var_dwarf_2dde16 + 9,&local_5b9);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)&local_5e0);
        std::__cxx11::string::~string((string *)&local_5e0);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_(&local_5e0,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5e0,anon_var_dwarf_2dde16 + 9,&local_5ba);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)&local_5e0);
        std::__cxx11::string::~string((string *)&local_5e0);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_(&local_5e0,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5e0,anon_var_dwarf_2dde16 + 9,&local_5bb);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)&local_5e0);
        std::__cxx11::string::~string((string *)&local_5e0);
      }
      if (response != (RdsRegionCreatePostpaidDBInstanceResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"DBInstanceId");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"DBInstanceId");
          Json::Value::asString_abi_cxx11_(&local_5e0,pVVar3);
          std::__cxx11::string::operator=((string *)response,(string *)&local_5e0);
          std::__cxx11::string::~string((string *)&local_5e0);
        }
        bVar1 = Json::Value::isMember(&val,"OrderId");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"OrderId");
          Json::Value::asString_abi_cxx11_(&local_5e0,pVVar3);
          std::__cxx11::string::operator=((string *)&response->order_id,(string *)&local_5e0);
          std::__cxx11::string::~string((string *)&local_5e0);
        }
        bVar1 = Json::Value::isMember(&val,"ConnectionString");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"ConnectionString");
          Json::Value::asString_abi_cxx11_(&local_5e0,pVVar3);
          std::__cxx11::string::operator=
                    ((string *)&response->connection_string,(string *)&local_5e0);
          std::__cxx11::string::~string((string *)&local_5e0);
        }
        bVar1 = Json::Value::isMember(&val,"Port");
        iVar2 = 200;
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"Port");
          Json::Value::asString_abi_cxx11_(&local_5e0,pVVar3);
          std::__cxx11::string::operator=((string *)&response->port,(string *)&local_5e0);
          std::__cxx11::string::~string((string *)&local_5e0);
        }
      }
      goto LAB_00154091;
    }
  }
  iVar2 = -1;
  if (error_info != (RdsRegionErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_00154091:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int RdsRegion::CreatePostpaidDBInstance(const RdsRegionCreatePostpaidDBInstanceRequestType& req,
                      RdsRegionCreatePostpaidDBInstanceResponseType* response,
                       RdsRegionErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","CreatePostpaidDBInstance");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.client_token.empty()) {
    req_rpc->AddRequestQuery("ClientToken", req.client_token);
  }
  if(!req.engine.empty()) {
    req_rpc->AddRequestQuery("Engine", req.engine);
  }
  if(!req.engine_version.empty()) {
    req_rpc->AddRequestQuery("EngineVersion", req.engine_version);
  }
  if(!req.db_instance_class.empty()) {
    req_rpc->AddRequestQuery("DBInstanceClass", req.db_instance_class);
  }
  if(!req.db_instance_storage.empty()) {
    req_rpc->AddRequestQuery("DBInstanceStorage", req.db_instance_storage);
  }
  if(!req.db_instance_net_type.empty()) {
    req_rpc->AddRequestQuery("DBInstanceNetType", req.db_instance_net_type);
  }
  if(!req.db_instance_description.empty()) {
    req_rpc->AddRequestQuery("DBInstanceDescription", req.db_instance_description);
  }
  if(!req.security_ip_list.empty()) {
    req_rpc->AddRequestQuery("SecurityIPList", req.security_ip_list);
  }
  if(!req.owner_account.empty()) {
    req_rpc->AddRequestQuery("OwnerAccount", req.owner_account);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}